

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O3

pair<llvm::StringMapIterator<bool>,_bool> __thiscall
llvm::StringMap<bool,_llvm::MallocAllocator>::try_emplace<bool>
          (StringMap<bool,_llvm::MallocAllocator> *this,StringRef Key,bool *Args)

{
  StringMapEntryBase **ppSVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  StringMapEntryBase *pSVar5;
  StringMapEntry<bool> *pSVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_> SVar8;
  bool *in_R8;
  StringRef Key_00;
  pair<llvm::StringMapIterator<bool>,_bool> pVar9;
  
  uVar3 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  SVar8.Ptr = (this->super_StringMapImpl).TheTable + uVar3;
  pSVar5 = *SVar8.Ptr;
  if (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8) {
    puVar2 = &(this->super_StringMapImpl).NumTombstones;
    *puVar2 = *puVar2 - 1;
  }
  else if (pSVar5 != (StringMapEntryBase *)0x0) {
    while ((pSVar5 == (StringMapEntryBase *)0x0 ||
           (pSVar5 == (StringMapEntryBase *)0xfffffffffffffff8))) {
      ppSVar1 = SVar8.Ptr + 1;
      SVar8.Ptr = SVar8.Ptr + 1;
      pSVar5 = *ppSVar1;
    }
    uVar7 = 0;
    goto LAB_0016e8c4;
  }
  Key_00.Length = (size_t)&this->field_0x18;
  Key_00.Data = (char *)Key.Length;
  pSVar6 = StringMapEntry<bool>::Create<llvm::MallocAllocator,bool>
                     ((StringMapEntry<bool> *)Key.Data,Key_00,(MallocAllocator *)Args,in_R8);
  *SVar8.Ptr = &pSVar6->super_StringMapEntryBase;
  uVar4 = (this->super_StringMapImpl).NumItems + 1;
  (this->super_StringMapImpl).NumItems = uVar4;
  if ((this->super_StringMapImpl).NumBuckets < uVar4 + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<bool>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = bool, AllocatorTy = llvm::MallocAllocator, ArgsTy = <bool>]"
                 );
  }
  uVar3 = StringMapImpl::RehashTable(&this->super_StringMapImpl,uVar3);
  for (SVar8.Ptr = (this->super_StringMapImpl).TheTable + uVar3;
      (*SVar8.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar8.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar8.Ptr = SVar8.Ptr + 1) {
  }
  uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_0016e8c4:
  pVar9._8_8_ = uVar7;
  pVar9.first.super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>.
  Ptr = (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)
        (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)SVar8.Ptr;
  return pVar9;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }